

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall AActor::SetOrigin(AActor *this,double x,double y,double z,bool moving)

{
  undefined7 in_register_00000031;
  FLinkContext ctx;
  
  ctx.sector_list = (msecnode_t *)0x0;
  ctx.render_list = (msecnode_t *)0x0;
  UnlinkFromWorld(this,&ctx);
  (this->__Pos).Z = z;
  (this->__Pos).Y = y;
  (this->__Pos).X = x;
  LinkToWorld(this,&ctx,false,(sector_t *)0x0);
  P_FindFloorCeiling(this,1);
  if ((int)CONCAT71(in_register_00000031,moving) == 0) {
    ClearInterpolation(this);
  }
  return;
}

Assistant:

void AActor::SetOrigin(double x, double y, double z, bool moving)
{
	FLinkContext ctx;
	UnlinkFromWorld (&ctx);
	SetXYZ(x, y, z);
	LinkToWorld (&ctx);
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS);
	if (!moving) ClearInterpolation();
}